

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

bool __thiscall Moc::testFunctionRevision(Moc *this,FunctionDef *def)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  Moc *in_stack_00000010;
  Token in_stack_ffffffffffffffd4;
  QTypeRevision local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = Parser::test(in_RDI,in_stack_ffffffffffffffd4);
  if (bVar1) {
    local_a = parseRevision(in_stack_00000010);
    iVar2 = QTypeRevision::toEncodedVersion<int,_true>(&local_a);
    *(int *)(in_RSI + 0xbc) = iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool Moc::testFunctionRevision(FunctionDef *def)
{

    if (test(Q_REVISION_TOKEN)) {
        def->revision = parseRevision().toEncodedVersion<int>();
        return true;
    }

    return false;
}